

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.hpp
# Opt level: O0

Span<int,_18446744073709551615UL> __thiscall
MILBlob::Util::Span<int,_18446744073709551615UL>::SliceByDimension
          (Span<int,_18446744073709551615UL> *this,size_t num_slices,size_t slice_index)

{
  size_t sVar1;
  range_error *this_00;
  Span<int,_18446744073709551615UL> SVar2;
  size_t stride;
  size_t slice_index_local;
  size_t num_slices_local;
  Span<int,_18446744073709551615UL> *this_local;
  
  sVar1 = Size(this);
  if (sVar1 % num_slices != 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"index out of bounds");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  sVar1 = Size(this);
  SVar2 = Slice(this,slice_index * (sVar1 / num_slices),sVar1 / num_slices);
  return SVar2;
}

Assistant:

Span<T> SliceByDimension(size_t num_slices, size_t slice_index) const
    {
        MILVerifyIsTrue(Size() % num_slices == 0, std::range_error, "index out of bounds");
        size_t stride = Size() / num_slices;
        return Slice(slice_index * stride, stride);
    }